

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O3

void __thiscall
CommandLineArguments::setRepeatCount(CommandLineArguments *this,int ac,char **av,int *i)

{
  int iVar1;
  size_t sVar2;
  SimpleString repeatParameter;
  SimpleString SStack_38;
  
  this->repeat_ = 0;
  SimpleString::SimpleString(&SStack_38,av[*i]);
  sVar2 = SimpleString::size(&SStack_38);
  if (sVar2 < 3) {
    iVar1 = *i + 1;
    if (ac <= iVar1) {
      sVar2 = this->repeat_;
      goto LAB_0014492f;
    }
    iVar1 = SimpleString::AtoI(av[iVar1]);
    this->repeat_ = (long)iVar1;
    if (iVar1 != 0) {
      *i = *i + 1;
      sVar2 = 1;
      goto LAB_0014492f;
    }
  }
  else {
    iVar1 = SimpleString::AtoI(av[*i] + 2);
    sVar2 = (size_t)iVar1;
    this->repeat_ = sVar2;
LAB_0014492f:
    if (sVar2 != 0) goto LAB_0014493c;
  }
  this->repeat_ = 2;
LAB_0014493c:
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

void CommandLineArguments::setRepeatCount(int ac, const char *const *av, int& i)
{
    repeat_ = 0;

    SimpleString repeatParameter(av[i]);
    if (repeatParameter.size() > 2) repeat_ = (size_t) (SimpleString::AtoI(av[i] + 2));
    else if (i + 1 < ac) {
        repeat_ = (size_t) (SimpleString::AtoI(av[i + 1]));
        if (repeat_ != 0) i++;
    }

    if (0 == repeat_) repeat_ = 2;

}